

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxClassTypeCast::Resolve(FxClassTypeCast *this,FCompileContext *ctx)

{
  PPointer *pPVar1;
  PClass *pPVar2;
  PType *this_00;
  FxExpression *pFVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar6;
  FxExpression *pFVar7;
  PClass *pPVar8;
  FxClassTypeCast *pFVar9;
  PClass *pPVar10;
  char *message;
  FScriptPosition *other;
  char *pcVar11;
  FName clsname;
  undefined1 local_44 [12];
  FString local_38;
  FName local_2c;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->basex == (FxExpression *)0x0) {
LAB_00538b2e:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return &((FxClassTypeCast *)0x0)->super_FxExpression;
  }
  iVar5 = (*this->basex->_vptr_FxExpression[2])();
  pFVar9 = (FxClassTypeCast *)CONCAT44(extraout_var,iVar5);
  this->basex = (FxExpression *)pFVar9;
  if (pFVar9 == (FxClassTypeCast *)0x0) goto LAB_00538b2e;
  pPVar1 = (PPointer *)(pFVar9->super_FxExpression).ValueType;
  pPVar2 = (PClass *)(this->super_FxExpression).ValueType;
  if (pPVar1 != TypeNullPtr) {
    pPVar8 = (pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar5 = (**(pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject._vptr_DObject)
                        (pPVar1);
      pPVar8 = (PClass *)CONCAT44(extraout_var_00,iVar5);
      (pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject.Class = pPVar8;
    }
    pFVar9 = (FxClassTypeCast *)this->basex;
    this_00 = (pFVar9->super_FxExpression).ValueType;
    if (pPVar8 != PClassPointer::RegistrationInfo.MyClass) {
      if ((this_00 != (PType *)TypeName) && (this_00 != (PType *)TypeString)) {
        pcVar6 = PType::DescriptiveName(this_00);
        pFVar9 = (FxClassTypeCast *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Cannot convert %s to class type",
                   pcVar6);
        goto LAB_00538b79;
      }
      iVar5 = (*(pFVar9->super_FxExpression)._vptr_FxExpression[3])(pFVar9);
      if ((char)iVar5 == '\0') {
        if (this->basex->ValueType != (PType *)TypeString) {
          return &this->super_FxExpression;
        }
        pFVar7 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x30);
        pFVar3 = this->basex;
        pFVar7->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition(&pFVar7->ScriptPosition,&pFVar3->ScriptPosition);
        pFVar7->isresolved = false;
        pFVar7->NeedResult = true;
        pFVar7->ExprType = EFX_NameCast;
        pFVar7->_vptr_FxExpression = (_func_int **)&PTR__FxNameCast_0070b680;
        pFVar7[1]._vptr_FxExpression = (_func_int **)pFVar3;
        pFVar7->ValueType = (PType *)TypeName;
        this->basex = pFVar7;
        return &this->super_FxExpression;
      }
      local_44._4_8_ = this->basex[1]._vptr_FxExpression;
      other = &this->basex[1].ScriptPosition;
      if ((PString *)local_44._4_8_ == TypeString) {
        FString::AttachToOther(&local_38,&other->FileName);
      }
      else {
        local_38.Chars = (other->FileName).Chars;
      }
      ExpVal::GetName((ExpVal *)local_44);
      if ((PString *)local_44._4_8_ == TypeString) {
        FString::~FString(&local_38);
      }
      if (local_44._0_4_ == 0) {
        pPVar8 = (PClass *)0x0;
      }
      else {
        local_2c.Index = local_44._0_4_;
        pPVar8 = PClass::FindClass(&local_2c);
        if (pPVar8 == (PClass *)0x0) {
          pcVar6 = FName::NameData.NameArray[(int)local_44._0_4_].Text;
          pcVar11 = FName::NameData.NameArray
                    [(this->desttype->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.
                     Index].Text;
          message = "Unknown class name \'%s\' of type \'%s\'";
LAB_00538d88:
          pPVar8 = (PClass *)0x0;
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,3,message,pcVar6,pcVar11);
        }
        else {
          pPVar4 = this->desttype;
          pPVar10 = pPVar8;
          if (pPVar8 != pPVar4) {
            do {
              pPVar10 = pPVar10->ParentClass;
              if (pPVar10 == pPVar4) break;
            } while (pPVar10 != (PClass *)0x0);
            if (pPVar10 == (PClass *)0x0) {
              pcVar6 = FName::NameData.NameArray[(int)local_44._0_4_].Text;
              pcVar11 = FName::NameData.NameArray
                        [(pPVar4->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index
                        ].Text;
              message = "class \'%s\' is not compatible with \'%s\'";
              goto LAB_00538d88;
            }
          }
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,8,"resolving \'%s\' as class name",
                     FName::NameData.NameArray[(int)local_44._0_4_].Text);
        }
      }
      pFVar9 = (FxClassTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
      (pFVar9->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
      FScriptPosition::FScriptPosition
                (&(pFVar9->super_FxExpression).ScriptPosition,
                 &(this->super_FxExpression).ScriptPosition);
      (pFVar9->super_FxExpression).ExprType = EFX_Constant;
      (pFVar9->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
      pFVar9->basex = (FxExpression *)pPVar8;
      (pFVar9->super_FxExpression).ValueType = (PType *)pPVar2;
      pFVar9->desttype = pPVar2;
      (pFVar9->super_FxExpression).isresolved = true;
      (pFVar9->super_FxExpression).NeedResult = true;
      goto LAB_00538b79;
    }
    pPVar8 = (PClass *)this_00[1].super_PTypeBase.super_DObject.ObjNext;
    pPVar4 = (PClass *)(pPVar2->super_PNativeStruct).super_PStruct.Fields.Array;
    pPVar10 = pPVar8;
    if (pPVar8 != pPVar4) {
      do {
        pPVar10 = (PClass *)
                  ((TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
                    *)&pPVar10->ParentClass)->Array;
        if (pPVar10 == pPVar4) break;
      } while (pPVar10 != (PClass *)0x0);
      if (pPVar10 == (PClass *)0x0) {
        pFVar9 = (FxClassTypeCast *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "Cannot convert from %s to %s: Incompatible class types",
                   FName::NameData.NameArray
                   [*(int *)&((DObject *)
                             &(pPVar8->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName)
                             ->_vptr_DObject].Text,
                   FName::NameData.NameArray
                   [*(int *)&((DObject *)
                             &(pPVar4->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName)
                             ->_vptr_DObject].Text);
        goto LAB_00538b79;
      }
    }
  }
  (pFVar9->super_FxExpression).ValueType = (PType *)pPVar2;
  this->basex = (FxExpression *)0x0;
LAB_00538b79:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return &pFVar9->super_FxExpression;
}

Assistant:

FxExpression *FxClassTypeCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeNullPtr)
	{
		basex->ValueType = ValueType;
		auto x = basex;
		basex = nullptr;
		delete this;
		return x;
	}
	auto to = static_cast<PClassPointer *>(ValueType);
	if (basex->ValueType->GetClass() == RUNTIME_CLASS(PClassPointer))
	{
		auto from = static_cast<PClassPointer *>(basex->ValueType);
		if (from->ClassRestriction->IsDescendantOf(to->ClassRestriction))
		{
			basex->ValueType = to;
			auto x = basex;
			basex = nullptr;
			delete this;
			return x;
		}
		ScriptPosition.Message(MSG_ERROR, "Cannot convert from %s to %s: Incompatible class types", from->ClassRestriction->TypeName.GetChars(), to->ClassRestriction->TypeName.GetChars());
		delete this;
		return nullptr;
	}
	
	if (basex->ValueType != TypeName && basex->ValueType != TypeString)
	{
		ScriptPosition.Message(MSG_ERROR, "Cannot convert %s to class type", basex->ValueType->DescriptiveName());
		delete this;
		return nullptr;
	}

	if (basex->isConstant())
	{
		FName clsname = static_cast<FxConstant *>(basex)->GetValue().GetName();
		PClass *cls = nullptr;

		if (clsname != NAME_None)
		{
			cls = PClass::FindClass(clsname);
			if (cls == nullptr)
			{
				/* lax */
				// Since this happens in released WADs it must pass without a terminal error... :(
				ScriptPosition.Message(MSG_OPTERROR,
					"Unknown class name '%s' of type '%s'",
					clsname.GetChars(), desttype->TypeName.GetChars());
			}
			else
			{
				if (!cls->IsDescendantOf(desttype))
				{
					ScriptPosition.Message(MSG_OPTERROR, "class '%s' is not compatible with '%s'", clsname.GetChars(), desttype->TypeName.GetChars());
					cls = nullptr;
				}
				else ScriptPosition.Message(MSG_DEBUGLOG, "resolving '%s' as class name", clsname.GetChars());
			}
		}
		FxExpression *x = new FxConstant(cls, to, ScriptPosition);
		delete this;
		return x;
	}
	if (basex->ValueType == TypeString)
	{
		basex = new FxNameCast(basex);
	}
	return this;
}